

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMateGeneric::ChangedLinkMask(ChLinkMateGeneric *this)

{
  ChLinkMask *this_00;
  int iVar1;
  
  this_00 = &this->mask;
  iVar1 = ChLinkMask::GetMaskDoc(this_00);
  this->ndoc = iVar1;
  iVar1 = ChLinkMask::GetMaskDoc_c(this_00);
  this->ndoc_c = iVar1;
  iVar1 = ChLinkMask::GetMaskDoc_d(this_00);
  this->ndoc_d = iVar1;
  return;
}

Assistant:

void ChLinkMateGeneric::ChangedLinkMask() {
    ndoc = mask.GetMaskDoc();
    ndoc_c = mask.GetMaskDoc_c();
    ndoc_d = mask.GetMaskDoc_d();
}